

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdPatternColorR5G5B5::emulate_mthd(MthdPatternColorR5G5B5 *this)

{
  uint32_t uVar1;
  int local_18;
  uint8_t r;
  uint8_t g;
  uint8_t b;
  int i;
  uint32_t rval;
  MthdPatternColorR5G5B5 *this_local;
  
  uVar1 = nv04_pgraph_hswap(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
                            (this->super_SingleMthdTest).super_MthdTest.val);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.pattern_color
    [*(int *)&(this->super_SingleMthdTest).super_MthdTest.field_0x25914 * 2 + local_18] =
         (uint)CONCAT12((char)((((ulong)uVar1 << (0x3bU - ((char)(local_18 << 4) + '\n') & 0x3f)) >>
                               0x3b) * 0x21 >> 2),
                        CONCAT11((char)((((ulong)uVar1 <<
                                         (0x3bU - ((char)(local_18 << 4) + '\x05') & 0x3f)) >> 0x3b)
                                        * 0x21 >> 2),
                                 (char)((((ulong)uVar1 << (0x3bU - (char)(local_18 << 4) & 0x3f)) >>
                                        0x3b) * 0x21 >> 2)));
  }
  return;
}

Assistant:

void emulate_mthd() override {
		uint32_t rval = nv04_pgraph_hswap(&exp, val);
		for (int i = 0; i < 2; i++) {
			uint8_t b = extr(rval, i * 16 + 0, 5) * 0x21 >> 2;
			uint8_t g = extr(rval, i * 16 + 5, 5) * 0x21 >> 2;
			uint8_t r = extr(rval, i * 16 + 10, 5) * 0x21 >> 2;
			exp.pattern_color[idx*2+i] = b | g << 8 | r << 16;
		}
	}